

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_list_long_Test<char16_t>::TestBody
          (SplitCompilationTest_empty_list_long_Test<char16_t> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  pointer *__ptr;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> delim;
  AssertHelper local_80 [8];
  long *local_78;
  byte local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _List_node_base local_60;
  _List_node_base local_50;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  
  make_delim_long<char16_t,std::__cxx11::u16string>(&local_40,8,L'\0');
  jessilib::
  split<std::__cxx11::list,_const_char16_t_*,_const_char16_t_*,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ((container_type *)&local_60,(char16_t *)0x0,(char16_t *)0x0,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_40._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_40._M_dataplus._M_p + local_40._M_string_length));
  local_70[0] = local_60._M_next == &local_60;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)&local_60);
  if (local_70[0] == 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,(char *)local_70,
               "split<std::list>(empty, delim).empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,99,(char *)local_60._M_next);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if (local_60._M_next != &local_50) {
      operator_delete(local_60._M_next,(ulong)((long)&(local_50._M_next)->_M_next + 1));
    }
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  jessilib::
  split_n<std::__cxx11::list,_const_char16_t_*,_const_char16_t_*,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ((container_type *)&local_60,(char16_t *)0x0,(char16_t *)0x0,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_40._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_40._M_dataplus._M_p + local_40._M_string_length),5);
  local_70[0] = local_60._M_next == &local_60;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              *)&local_60);
  if (local_70[0] == 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_60,(char *)local_70,
               "split_n<std::list>(empty, delim, 5).empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
               ,100,(char *)local_60._M_next);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if (local_60._M_next != &local_50) {
      operator_delete(local_60._M_next,(ulong)((long)&(local_50._M_next)->_M_next + 1));
    }
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  jessilib::
  split<std::__cxx11::list,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_const_char16_t_*,_const_char16_t_*,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ((container_type *)&local_60,(char16_t *)0x0,(char16_t *)0x0,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_40._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_40._M_dataplus._M_p + local_40._M_string_length));
  local_70[0] = local_60._M_next == &local_60;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70[0]) {
    p_Var2 = local_60._M_next;
    do {
      p_Var3 = (((_List_impl *)&p_Var2->_M_next)->_M_node).super__List_node_base._M_next;
      operator_delete(p_Var2,0x20);
      p_Var2 = p_Var3;
    } while (p_Var3 != &local_60);
    if ((local_70[0] & 1) == 0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_60,(char *)local_70,
                 "split_view<std::list>(empty, delim).empty()","false");
      testing::internal::AssertHelper::AssertHelper
                (local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
                 ,0x65,(char *)local_60._M_next);
      testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(local_80);
      if (local_60._M_next != &local_50) {
        operator_delete(local_60._M_next,(ulong)((long)&(local_50._M_next)->_M_next + 1));
      }
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  jessilib::
  split_n<std::__cxx11::list,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_const_char16_t_*,_const_char16_t_*,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ((container_type *)&local_60,(char16_t *)0x0,(char16_t *)0x0,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_40._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_40._M_dataplus._M_p + local_40._M_string_length),5);
  p_Var2 = local_60._M_next;
  local_70[0] = local_60._M_next == &local_60;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70[0]) {
    p_Var3 = local_60._M_next;
    do {
      p_Var1 = (((_List_impl *)&p_Var3->_M_next)->_M_node).super__List_node_base._M_next;
      operator_delete(p_Var3,0x20);
      p_Var3 = p_Var1;
    } while (p_Var1 != &local_60);
    if (p_Var2 != &local_60) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_60,(char *)local_70,
                 "split_n_view<std::list>(empty, delim, 5).empty()","false");
      testing::internal::AssertHelper::AssertHelper
                (local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split_compilation.cpp"
                 ,0x66,(char *)local_60._M_next);
      testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(local_80);
      if (local_60._M_next != &local_50) {
        operator_delete(local_60._M_next,(ulong)((long)&(local_50._M_next)->_M_next + 1));
      }
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::list>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::list>(empty, delim, 5).empty());
}